

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

pattern * idItem(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  pattern *ppVar6;
  char *pcVar7;
  uint val;
  char *s;
  char msg [200];
  char acStack_e8 [200];
  
  pcVar7 = SymTable[tokenval].lexptr;
  iVar2 = strncmp(pcVar7,"FILE",4);
  if ((iVar2 == 0) &&
     (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)pcVar7[4] * 2 + 1) & 8) != 0)) {
    val = parseInteger(pcVar7,4,10);
    iVar2 = 0x130;
    goto LAB_001250a5;
  }
  iVar2 = strncmp(pcVar7,"CHAIN",5);
  if (iVar2 == 0) {
    ppuVar4 = __ctype_b_loc();
    if (((long)pcVar7[5] == 0x5f) || (((*ppuVar4)[pcVar7[5]] & 8) != 0)) {
      s = pcVar7 + 5;
      pcVar5 = s;
      do {
        if (*pcVar5 == '_') {
          *pcVar5 = ' ';
        }
        else if (*pcVar5 == '\0') goto LAB_00124fa8;
        pcVar5 = pcVar5 + 1;
      } while( true );
    }
  }
  iVar2 = strncmp(pcVar7,"ALT",3);
  if (iVar2 == 0) {
    ppuVar4 = __ctype_b_loc();
    cVar1 = pcVar7[3];
    if (((long)cVar1 == 0x5f) || (((*ppuVar4)[cVar1] & 8) != 0)) {
      if (cVar1 == '_') {
        pcVar7[3] = ' ';
      }
      val = (uint)(byte)pcVar7[3];
      iVar2 = 0x133;
      goto LAB_001250a5;
    }
  }
  iVar2 = strncmp(pcVar7,"MODEL",5);
  if ((iVar2 == 0) &&
     (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)pcVar7[5] * 2 + 1) & 8) != 0)) {
    val = parseInteger(pcVar7,5,10);
    iVar2 = 0x131;
    goto LAB_001250a5;
  }
  iVar2 = strncmp(pcVar7,"ATOM",4);
  if (iVar2 == 0) {
    ppuVar4 = __ctype_b_loc();
    if (((long)pcVar7[4] == 0x5f) || (((*ppuVar4)[pcVar7[4]] & 8) != 0)) {
      s = pcVar7 + 4;
      pcVar7 = s;
      do {
        if (*pcVar7 == '_') {
          *pcVar7 = ' ';
        }
        else if (*pcVar7 == '\0') goto LAB_0012502e;
        pcVar7 = pcVar7 + 1;
      } while( true );
    }
  }
  iVar2 = strncmp(pcVar7,"SEG",3);
  if (iVar2 == 0) {
    ppuVar4 = __ctype_b_loc();
    if (((long)pcVar7[3] == 0x5f) || (((*ppuVar4)[pcVar7[3]] & 8) != 0)) {
      s = pcVar7 + 3;
      pcVar7 = s;
      do {
        if (*pcVar7 == '_') {
          *pcVar7 = ' ';
        }
        else if (*pcVar7 == '\0') goto LAB_0012505a;
        pcVar7 = pcVar7 + 1;
      } while( true );
    }
  }
  iVar2 = strcmp(pcVar7,"ALL");
  val = 0;
  if (iVar2 == 0) {
    iVar2 = 0x136;
    goto LAB_001250a5;
  }
  iVar3 = strcmp(pcVar7,"NONE");
  iVar2 = 0x137;
  val = 0;
  if (iVar3 == 0) goto LAB_001250a5;
  iVar3 = strcmp(pcVar7,"ALPHA");
  if (iVar3 == 0) {
    val = 4;
  }
  else {
    iVar3 = strcmp(pcVar7,"BETA");
    if (iVar3 == 0) {
      val = 8;
    }
    else {
      iVar3 = strcmp(pcVar7,"MAINCHAIN");
      val = 1;
      if (((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"MC"), iVar3 != 0)) &&
         (iVar3 = strcmp(pcVar7,"BACKBONE"), iVar3 != 0)) {
        iVar3 = strcmp(pcVar7,"SIDECHAIN");
        val = 2;
        if (((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"SC"), iVar3 != 0)) &&
           (iVar3 = strcmp(pcVar7,"BASE"), iVar3 != 0)) {
          iVar3 = strcmp(pcVar7,"NITROGEN");
          if (iVar3 == 0) {
            val = 0x10;
          }
          else {
            iVar3 = strcmp(pcVar7,"CARBON");
            if (iVar3 == 0) {
              val = 0x20;
            }
            else {
              iVar3 = strcmp(pcVar7,"OXYGEN");
              if (iVar3 == 0) {
                val = 0x40;
              }
              else {
                iVar3 = strcmp(pcVar7,"SULFUR");
                if (iVar3 == 0) {
                  val = 0x80;
                }
                else {
                  iVar3 = strcmp(pcVar7,"PHOSPHORUS");
                  if (iVar3 == 0) {
                    val = 0x100;
                  }
                  else {
                    iVar3 = strcmp(pcVar7,"HYDROGEN");
                    if (iVar3 == 0) {
                      val = 0x200;
                    }
                    else {
                      iVar3 = strcmp(pcVar7,"H2O");
                      val = 0x400;
                      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"WATER"), iVar3 != 0)) {
                        iVar3 = strcmp(pcVar7,"HET");
                        val = 0x800;
                        if ((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"HETATM"), iVar3 != 0)) {
                          iVar3 = strcmp(pcVar7,"PROTEIN");
                          val = 0x1000;
                          if ((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"PEPTIDE"), iVar3 != 0)) {
                            iVar3 = strcmp(pcVar7,"DNA");
                            val = 0x2000;
                            if ((iVar3 != 0) && (iVar3 = strcmp(pcVar7,"RNA"), iVar3 != 0)) {
                              iVar3 = strcmp(pcVar7,"METAL");
                              if (iVar3 == 0) {
                                val = 0x4000;
                              }
                              else {
                                iVar3 = strcmp(pcVar7,"METHYLENE");
                                if (iVar3 == 0) {
                                  val = 0x40000000;
                                }
                                else {
                                  iVar3 = strcmp(pcVar7,"METHYL");
                                  if (iVar3 == 0) {
                                    val = 0x8000;
                                  }
                                  else {
                                    iVar3 = strcmp(pcVar7,"DONOR");
                                    if (iVar3 == 0) {
                                      val = 0x10000;
                                    }
                                    else {
                                      iVar3 = strcmp(pcVar7,"ACCEPTOR");
                                      if (iVar3 == 0) {
                                        val = 0x20000;
                                      }
                                      else {
                                        iVar3 = strcmp(pcVar7,"NONPOLAR");
                                        val = 0x800000;
                                        if ((((iVar3 != 0) &&
                                             (iVar3 = strcmp(pcVar7,"HYDROPHOBIC"), iVar3 != 0)) &&
                                            (iVar3 = strcmp(pcVar7,"HPHOBIC"), iVar3 != 0)) &&
                                           (iVar3 = strcmp(pcVar7,"PHOBIC"), iVar3 != 0)) {
                                          iVar3 = strcmp(pcVar7,"POLAR");
                                          val = 0x1000000;
                                          if (((iVar3 != 0) &&
                                              (iVar3 = strcmp(pcVar7,"HYDROPHILIC"), iVar3 != 0)) &&
                                             ((iVar3 = strcmp(pcVar7,"HPHILIC"), iVar3 != 0 &&
                                              (iVar3 = strcmp(pcVar7,"PHILIC"), iVar3 != 0)))) {
                                            iVar3 = strcmp(pcVar7,"CHARGED");
                                            val = 0x2000000;
                                            if ((iVar3 != 0) &&
                                               (iVar3 = strcmp(pcVar7,"CHARGE"), iVar3 != 0)) {
                                              iVar3 = strcmp(pcVar7,"AROMATIC");
                                              if (iVar3 != 0) {
                                                iVar3 = strcmp(pcVar7,"GLY");
                                                if ((iVar3 == 0) ||
                                                   (iVar3 = strcmp(pcVar7,"G"), iVar3 == 0)) {
                                                  val = lookup("GLY");
                                                  iVar2 = 0x135;
                                                  if (val != 0) goto LAB_001250a5;
                                                  s = "GLY";
                                                  iVar3 = 0x135;
                                                }
                                                else {
                                                  iVar3 = strcmp(pcVar7,"ALA");
                                                  if ((iVar3 == 0) ||
                                                     (iVar3 = strcmp(pcVar7,"A"), iVar3 == 0)) {
                                                    val = lookup("ALA");
                                                    iVar2 = 0x135;
                                                    if (val != 0) goto LAB_001250a5;
                                                    s = "ALA";
                                                    iVar3 = 0x135;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar7,"VAL");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar7,"V"), iVar3 == 0)) {
                                                      val = lookup("VAL");
                                                      iVar2 = 0x135;
                                                      if (val != 0) goto LAB_001250a5;
                                                      s = "VAL";
                                                      iVar3 = 0x135;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar7,"PHE");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar7,"F"), iVar3 == 0)) {
                                                        val = lookup("PHE");
                                                        iVar2 = 0x135;
                                                        if (val != 0) goto LAB_001250a5;
                                                        s = "PHE";
                                                        iVar3 = 0x135;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar7,"PRO");
                                                        if ((iVar3 == 0) ||
                                                           (iVar3 = strcmp(pcVar7,"P"), iVar3 == 0))
                                                        {
                                                          val = lookup("PRO");
                                                          iVar2 = 0x135;
                                                          if (val != 0) goto LAB_001250a5;
                                                          s = "PRO";
                                                          iVar3 = 0x135;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar7,"MET");
                                                          if ((iVar3 == 0) ||
                                                             (iVar3 = strcmp(pcVar7,"M"), iVar3 == 0
                                                             )) {
                                                            val = lookup("MET");
                                                            iVar2 = 0x135;
                                                            if (val != 0) goto LAB_001250a5;
                                                            s = "MET";
                                                            iVar3 = 0x135;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar7,"ILE");
                                                            if ((iVar3 == 0) ||
                                                               (iVar3 = strcmp(pcVar7,"I"),
                                                               iVar3 == 0)) {
                                                              val = lookup("ILE");
                                                              iVar2 = 0x135;
                                                              if (val != 0) goto LAB_001250a5;
                                                              s = "ILE";
                                                              iVar3 = 0x135;
                                                            }
                                                            else {
                                                              iVar3 = strcmp(pcVar7,"LEU");
                                                              if ((iVar3 == 0) ||
                                                                 (iVar3 = strcmp(pcVar7,"L"),
                                                                 iVar3 == 0)) {
                                                                val = lookup("LEU");
                                                                iVar2 = 0x135;
                                                                if (val != 0) goto LAB_001250a5;
                                                                s = "LEU";
                                                                iVar3 = 0x135;
                                                              }
                                                              else {
                                                                iVar3 = strcmp(pcVar7,"ASP");
                                                                if ((iVar3 == 0) ||
                                                                   (iVar3 = strcmp(pcVar7,"D"),
                                                                   iVar3 == 0)) {
                                                                  val = lookup("ASP");
                                                                  iVar2 = 0x135;
                                                                  if (val != 0) goto LAB_001250a5;
                                                                  s = "ASP";
                                                                  iVar3 = 0x135;
                                                                }
                                                                else {
                                                                  iVar3 = strcmp(pcVar7,"GLU");
                                                                  if ((iVar3 == 0) ||
                                                                     (iVar3 = strcmp(pcVar7,"E"),
                                                                     iVar3 == 0)) {
                                                                    val = lookup("GLU");
                                                                    iVar2 = 0x135;
                                                                    if (val != 0) goto LAB_001250a5;
                                                                    s = "GLU";
                                                                    iVar3 = 0x135;
                                                                  }
                                                                  else {
                                                                    iVar3 = strcmp(pcVar7,"LYS");
                                                                    if ((iVar3 == 0) ||
                                                                       (iVar3 = strcmp(pcVar7,"K"),
                                                                       iVar3 == 0)) {
                                                                      val = lookup("LYS");
                                                                      iVar2 = 0x135;
                                                                      if (val != 0)
                                                                      goto LAB_001250a5;
                                                                      s = "LYS";
                                                                      iVar3 = 0x135;
                                                                    }
                                                                    else {
                                                                      iVar3 = strcmp(pcVar7,"ARG");
                                                                      if ((iVar3 == 0) ||
                                                                         (iVar3 = strcmp(pcVar7,"R")
                                                                         , iVar3 == 0)) {
                                                                        val = lookup("ARG");
                                                                        iVar2 = 0x135;
                                                                        if (val != 0)
                                                                        goto LAB_001250a5;
                                                                        s = "ARG";
                                                                        iVar3 = 0x135;
                                                                      }
                                                                      else {
                                                                        iVar3 = strcmp(pcVar7,"SER")
                                                                        ;
                                                                        if ((iVar3 == 0) ||
                                                                           (iVar3 = strcmp(pcVar7,
                                                  "S"), iVar3 == 0)) {
                                                    val = lookup("SER");
                                                    iVar2 = 0x135;
                                                    if (val != 0) goto LAB_001250a5;
                                                    s = "SER";
                                                    iVar3 = 0x135;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar7,"THR");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar7,"T"), iVar3 == 0)) {
                                                      val = lookup("THR");
                                                      iVar2 = 0x135;
                                                      if (val != 0) goto LAB_001250a5;
                                                      s = "THR";
                                                      iVar3 = 0x135;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar7,"TYR");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar7,"Y"), iVar3 == 0)) {
                                                        val = lookup("TYR");
                                                        iVar2 = 0x135;
                                                        if (val != 0) goto LAB_001250a5;
                                                        s = "TYR";
                                                        iVar3 = 0x135;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar7,"HIS");
                                                        if ((iVar3 == 0) ||
                                                           (iVar3 = strcmp(pcVar7,"H"), iVar3 == 0))
                                                        {
                                                          val = lookup("HIS");
                                                          iVar2 = 0x135;
                                                          if (val != 0) goto LAB_001250a5;
                                                          s = "HIS";
                                                          iVar3 = 0x135;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar7,"CYS");
                                                          if ((iVar3 == 0) ||
                                                             (iVar3 = strcmp(pcVar7,"C"), iVar3 == 0
                                                             )) {
                                                            val = lookup("CYS");
                                                            iVar2 = 0x135;
                                                            if (val != 0) goto LAB_001250a5;
                                                            s = "CYS";
                                                            iVar3 = 0x135;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar7,"ASN");
                                                            if ((iVar3 == 0) ||
                                                               (iVar3 = strcmp(pcVar7,"N"),
                                                               iVar3 == 0)) {
                                                              val = lookup("ASN");
                                                              iVar2 = 0x135;
                                                              if (val != 0) goto LAB_001250a5;
                                                              s = "ASN";
                                                              iVar3 = 0x135;
                                                            }
                                                            else {
                                                              iVar3 = strcmp(pcVar7,"GLN");
                                                              if ((iVar3 == 0) ||
                                                                 (iVar3 = strcmp(pcVar7,"Q"),
                                                                 iVar3 == 0)) {
                                                                val = lookup("GLN");
                                                                iVar2 = 0x135;
                                                                if (val != 0) goto LAB_001250a5;
                                                                s = "GLN";
                                                                iVar3 = 0x135;
                                                              }
                                                              else {
                                                                iVar3 = strcmp(pcVar7,"TRP");
                                                                if ((iVar3 == 0) ||
                                                                   (iVar3 = strcmp(pcVar7,"W"),
                                                                   iVar3 == 0)) {
                                                                  val = lookup("TRP");
                                                                  iVar2 = 0x135;
                                                                  if (val != 0) goto LAB_001250a5;
                                                                  s = "TRP";
                                                                  iVar3 = 0x135;
                                                                }
                                                                else {
                                                                  iVar3 = strcmp(pcVar7,"ACE");
                                                                  if (iVar3 == 0) {
                                                                    val = lookup("ACE");
                                                                    iVar2 = 0x135;
                                                                    if (val != 0) goto LAB_001250a5;
                                                                    s = "ACE";
                                                                    iVar3 = 0x135;
                                                                  }
                                                                  else {
                                                                    iVar3 = strcmp(pcVar7,"ASX");
                                                                    if (iVar3 == 0) {
                                                                      val = lookup("ASX");
                                                                      iVar2 = 0x135;
                                                                      if (val != 0)
                                                                      goto LAB_001250a5;
                                                                      s = "ASX";
                                                                      iVar3 = 0x135;
                                                                    }
                                                                    else {
                                                                      iVar3 = strcmp(pcVar7,"GLX");
                                                                      if (iVar3 == 0) {
                                                                        val = lookup("GLX");
                                                                        iVar2 = 0x135;
                                                                        if (val != 0)
                                                                        goto LAB_001250a5;
                                                                        s = "GLX";
                                                                        iVar3 = 0x135;
                                                                      }
                                                                      else {
                                                                        iVar3 = strcmp(pcVar7,"MSE")
                                                                        ;
                                                                        if (iVar3 == 0) {
                                                                          val = lookup("MSE");
                                                                          iVar2 = 0x135;
                                                                          if (val != 0)
                                                                          goto LAB_001250a5;
                                                                          s = "MSE";
                                                                          iVar3 = 0x135;
                                                                        }
                                                                        else {
                                                                          iVar3 = strcmp(pcVar7,
                                                  "PCA");
                                                  if (iVar3 == 0) {
                                                    val = lookup("PCA");
                                                    iVar2 = 0x135;
                                                    if (val != 0) goto LAB_001250a5;
                                                    s = "PCA";
                                                    iVar3 = 0x135;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar7,"NH2");
                                                    if (iVar3 == 0) {
                                                      val = lookup("NH2");
                                                      iVar2 = 0x135;
                                                      if (val != 0) goto LAB_001250a5;
                                                      s = "NH2";
                                                      iVar3 = 0x135;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar7,"NME");
                                                      if (iVar3 == 0) {
                                                        val = lookup("NME");
                                                        iVar2 = 0x135;
                                                        if (val != 0) goto LAB_001250a5;
                                                        s = "NME";
                                                        iVar3 = 0x135;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar7,"FOR");
                                                        if (iVar3 != 0) {
                                                          iVar3 = strncmp(pcVar7,"RES",3);
                                                          if (iVar3 == 0) {
                                                            ppuVar4 = __ctype_b_loc();
                                                            if (((long)pcVar7[3] == 0x5f) ||
                                                               (((*ppuVar4)[pcVar7[3]] & 8) != 0)) {
                                                              s = pcVar7 + 3;
                                                              pcVar7 = s;
                                                              do {
                                                                if (*pcVar7 == '_') {
                                                                  *pcVar7 = ' ';
                                                                }
                                                                else if (*pcVar7 == '\0')
                                                                goto LAB_001255e0;
                                                                pcVar7 = pcVar7 + 1;
                                                              } while( true );
                                                            }
                                                          }
                                                          iVar3 = strncmp(pcVar7,"OLT",3);
                                                          if ((iVar3 == 0) &&
                                                             (ppuVar4 = __ctype_b_loc(),
                                                             (*(byte *)((long)*ppuVar4 +
                                                                       (long)pcVar7[3] * 2 + 1) & 8)
                                                             != 0)) {
                                                            val = parseInteger(pcVar7,3,10);
                                                            iVar2 = 0x13a;
                                                          }
                                                          else {
                                                            iVar3 = strncmp(pcVar7,"OGT",3);
                                                            if ((iVar3 == 0) &&
                                                               (ppuVar4 = __ctype_b_loc(),
                                                               (*(byte *)((long)*ppuVar4 +
                                                                         (long)pcVar7[3] * 2 + 1) &
                                                               8) != 0)) {
                                                              val = parseInteger(pcVar7,3,10);
                                                              iVar2 = 0x13b;
                                                            }
                                                            else {
                                                              iVar3 = strncmp(pcVar7,"BLT",3);
                                                              if ((iVar3 == 0) &&
                                                                 (ppuVar4 = __ctype_b_loc(),
                                                                 (*(byte *)((long)*ppuVar4 +
                                                                           (long)pcVar7[3] * 2 + 1)
                                                                 & 8) != 0)) {
                                                                val = parseInteger(pcVar7,3,10);
                                                                iVar2 = 0x13c;
                                                              }
                                                              else {
                                                                iVar3 = strncmp(pcVar7,"BGT",3);
                                                                if ((iVar3 == 0) &&
                                                                   (ppuVar4 = __ctype_b_loc(),
                                                                   (*(byte *)((long)*ppuVar4 +
                                                                             (long)pcVar7[3] * 2 + 1
                                                                             ) & 8) != 0)) {
                                                                  val = parseInteger(pcVar7,3,10);
                                                                  iVar2 = 0x13d;
                                                                }
                                                                else {
                                                                  iVar3 = strncmp(pcVar7,"INS",3);
                                                                  if (iVar3 == 0) {
                                                                    ppuVar4 = __ctype_b_loc();
                                                                    cVar1 = pcVar7[3];
                                                                    if (((long)cVar1 == 0x5f) ||
                                                                       (((*ppuVar4)[cVar1] & 8) != 0
                                                                       )) {
                                                                      if (cVar1 == '_') {
                                                                        pcVar7[3] = ' ';
                                                                      }
                                                                      val = (uint)(byte)pcVar7[3];
                                                                      iVar2 = 0x140;
                                                                      goto LAB_001250a5;
                                                                    }
                                                                  }
                                                                  val = 0;
                                                                  sprintf(acStack_e8,
                                                                                                                                                    
                                                  "syntax: unknown identifier: %s",pcVar7);
                                                  errmsg(acStack_e8);
                                                  ParseError = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  goto LAB_001250a5;
                                                  }
                                                  val = lookup("FOR");
                                                  iVar2 = 0x135;
                                                  if (val != 0) goto LAB_001250a5;
                                                  s = "FOR";
                                                  iVar3 = 0x135;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                                goto LAB_00125086;
                                              }
                                              val = 0x40000;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar2 = 0x138;
  goto LAB_001250a5;
LAB_00124fa8:
  if (pcVar7[6] == '\0') {
    pcVar7[4] = ' ';
    s = pcVar7 + 4;
    val = lookup(s);
    iVar2 = 0x132;
    goto LAB_0012507f;
  }
  val = lookup(s);
  iVar2 = 0x132;
  iVar3 = 0x132;
  if (val != 0) goto LAB_001250a5;
  goto LAB_00125086;
LAB_0012502e:
  val = lookup(s);
  iVar2 = 0x139;
  goto LAB_0012507f;
LAB_0012505a:
  val = lookup(s);
  iVar2 = 0x13f;
  goto LAB_0012507f;
LAB_001255e0:
  val = lookup(s);
  iVar2 = 0x135;
LAB_0012507f:
  iVar3 = iVar2;
  if (val == 0) {
LAB_00125086:
    iVar2 = iVar3;
    val = insert(s,0x193);
  }
LAB_001250a5:
  ppVar6 = makeTerminal(iVar2,val);
  matchTok(0x193);
  return ppVar6;
}

Assistant:

pattern* idItem() {
   pattern *lhs = NULL;
   int type = 0, val = 0;
   char *s, *tmpstr;

   s = SymTable[tokenval].lexptr;

   if ((strncmp(s, "FILE", 4) == 0) && isdigit(s[4])) {
      type = FILE_NODE; val = parseInteger(s,4,10);
   }
   else if ((strncmp(s, "CHAIN", 5) == 0) && (isalnum(s[5])||(s[5]=='_'))) {
      type = CHAIN_NODE;
      for(tmpstr = s+5;  *tmpstr; tmpstr++) { /* substitute blank for _ */
         if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      if (s[6] == '\0') { 
         s[4] = ' ';
         val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
      }
      else {
         val = lookup(s+5); if(val == 0) val = insert(s+5, ID_TOK);
      }
     /* type = CHAIN_NODE; val = (unsigned char)s[5]; */
   }
   else if ((strncmp(s, "ALT", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = ALT_NODE; val = (unsigned char)s[3];
   }
   else if ((strncmp(s, "MODEL", 5) == 0) && isdigit(s[5])) {
      type = MODEL_NODE; val = parseInteger(s,5,10);
   }
   else if ((strncmp(s, "ATOM", 4) == 0) && (isalnum(s[4])||(s[4]=='_'))) {
      type = ANAME_NODE;
      for(tmpstr = s+4; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+4); if(val == 0) val = insert(s+4, ID_TOK);
   }
   else if ((strncmp(s, "SEG", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = SEGID_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if (strcmp(s, "ALL") == 0) {
      type = TRUE_NODE; val = 0;
   }
   else if (strcmp(s, "NONE") == 0) {
      type = FALSE_NODE; val = 0;
   }
   else if (strcmp(s, "ALPHA") == 0) {
      type = PROP_NODE; val = ALPHA_PROP;
   }
   else if (strcmp(s, "BETA") == 0) {
      type = PROP_NODE; val = BETA_PROP;
   }
   else if ((strcmp(s, "MAINCHAIN") == 0) || (strcmp(s, "MC") == 0)
        ||  (strcmp(s, "BACKBONE") == 0)) {
      type = PROP_NODE; val = MC_PROP;
   }
   else if ((strcmp(s, "SIDECHAIN") == 0) || (strcmp(s, "SC") == 0)
        ||  (strcmp(s, "BASE") == 0)) {
      type = PROP_NODE; val = SC_PROP;
   }
   else if (strcmp(s, "NITROGEN") == 0) {
      type = PROP_NODE; val = N_PROP;
   }
   else if (strcmp(s, "CARBON") == 0) {
      type = PROP_NODE; val = C_PROP;
   }
   else if (strcmp(s, "OXYGEN") == 0) {
      type = PROP_NODE; val = O_PROP;
   }
   else if (strcmp(s, "SULFUR") == 0) {
      type = PROP_NODE; val = S_PROP;
   }
   else if (strcmp(s, "PHOSPHORUS") == 0) {
      type = PROP_NODE; val = P_PROP;
   }
   else if (strcmp(s, "HYDROGEN") == 0) {
      type = PROP_NODE; val = H_PROP;
   }
   else if ((strcmp(s, "H2O") == 0) || (strcmp(s, "WATER") == 0)) {
      type = PROP_NODE; val = WATER_PROP;
   }
   else if ((strcmp(s, "HET") == 0) || (strcmp(s, "HETATM") == 0)) {
      type = PROP_NODE; val = HET_PROP;
   }
   else if ((strcmp(s, "PROTEIN") == 0) || (strcmp(s, "PEPTIDE") == 0)) {
      type = PROP_NODE; val = PROT_PROP;
   }
   else if ((strcmp(s, "DNA") == 0) || (strcmp(s, "RNA") == 0)) {
      type = PROP_NODE; val = DNA_PROP;
   }
   else if (strcmp(s, "METAL") == 0) {
      type = PROP_NODE; val = METAL_PROP;
   }
   else if (strcmp(s, "METHYLENE") == 0) {
      type = PROP_NODE; val = METHYLENE_PROP;
   }/*longer name first*/
      else if (strcmp(s, "METHYL") == 0) {
      type = PROP_NODE; val = METHYL_PROP;
   }
   else if (strcmp(s, "DONOR") == 0) {
      type = PROP_NODE; val = DONOR_PROP;
   }
   else if (strcmp(s, "ACCEPTOR") == 0) {
      type = PROP_NODE; val = ACCEPTOR_PROP;
   }
   else if ((strcmp(s, "NONPOLAR") == 0) || (strcmp(s, "HYDROPHOBIC") == 0)
        ||  (strcmp(s, "HPHOBIC")== 0)|| (strcmp(s, "PHOBIC") == 0)) {
      type = PROP_NODE; val = RHPHOBIC_PROP;
   }
   else if ((strcmp(s, "POLAR") == 0) || (strcmp(s, "HYDROPHILIC") == 0)
        ||  (strcmp(s, "HPHILIC")== 0)|| (strcmp(s, "PHILIC") == 0)) {
      type = PROP_NODE; val = RHPHILIC_PROP;
   }
   else if ((strcmp(s, "CHARGED") == 0) || (strcmp(s, "CHARGE") == 0)) {
      type = PROP_NODE; val = RCHARGED_PROP;
   }
   else if (strcmp(s, "AROMATIC") == 0) {
      type = PROP_NODE; val = AROMATIC_PROP;
   }
   else if ((strcmp(s, "GLY") == 0) || (strcmp(s, "G") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLY"); if(val == 0) val = insert("GLY", ID_TOK);
   }
   else if ((strcmp(s, "ALA") == 0) || (strcmp(s, "A") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ALA"); if(val == 0) val = insert("ALA", ID_TOK);
   }
   else if ((strcmp(s, "VAL") == 0) || (strcmp(s, "V") == 0)) {
      type = RTYPE_NODE;
      val = lookup("VAL"); if(val == 0) val = insert("VAL", ID_TOK);
   }
   else if ((strcmp(s, "PHE") == 0) || (strcmp(s, "F") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PHE"); if(val == 0) val = insert("PHE", ID_TOK);
   }
   else if ((strcmp(s, "PRO") == 0) || (strcmp(s, "P") == 0)) {
      type = RTYPE_NODE;
      val = lookup("PRO"); if(val == 0) val = insert("PRO", ID_TOK);
   }
   else if ((strcmp(s, "MET") == 0) || (strcmp(s, "M") == 0)) {
      type = RTYPE_NODE;
      val = lookup("MET"); if(val == 0) val = insert("MET", ID_TOK);
   }
   else if ((strcmp(s, "ILE") == 0) || (strcmp(s, "I") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ILE"); if(val == 0) val = insert("ILE", ID_TOK);
   }
   else if ((strcmp(s, "LEU") == 0) || (strcmp(s, "L") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LEU"); if(val == 0) val = insert("LEU", ID_TOK);
   }
   else if ((strcmp(s, "ASP") == 0) || (strcmp(s, "D") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASP"); if(val == 0) val = insert("ASP", ID_TOK);
   }
   else if ((strcmp(s, "GLU") == 0) || (strcmp(s, "E") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLU"); if(val == 0) val = insert("GLU", ID_TOK);
   }
   else if ((strcmp(s, "LYS") == 0) || (strcmp(s, "K") == 0)) {
      type = RTYPE_NODE;
      val = lookup("LYS"); if(val == 0) val = insert("LYS", ID_TOK);
   }
   else if ((strcmp(s, "ARG") == 0) || (strcmp(s, "R") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ARG"); if(val == 0) val = insert("ARG", ID_TOK);
   }
   else if ((strcmp(s, "SER") == 0) || (strcmp(s, "S") == 0)) {
      type = RTYPE_NODE;
      val = lookup("SER"); if(val == 0) val = insert("SER", ID_TOK);
   }
   else if ((strcmp(s, "THR") == 0) || (strcmp(s, "T") == 0)) {
      type = RTYPE_NODE;
      val = lookup("THR"); if(val == 0) val = insert("THR", ID_TOK);
   }
   else if ((strcmp(s, "TYR") == 0) || (strcmp(s, "Y") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TYR"); if(val == 0) val = insert("TYR", ID_TOK);
   }
   else if ((strcmp(s, "HIS") == 0) || (strcmp(s, "H") == 0)) {
      type = RTYPE_NODE;
      val = lookup("HIS"); if(val == 0) val = insert("HIS", ID_TOK);
   }
   else if ((strcmp(s, "CYS") == 0) || (strcmp(s, "C") == 0)) {
      type = RTYPE_NODE;
      val = lookup("CYS"); if(val == 0) val = insert("CYS", ID_TOK);
   }
   else if ((strcmp(s, "ASN") == 0) || (strcmp(s, "N") == 0)) {
      type = RTYPE_NODE;
      val = lookup("ASN"); if(val == 0) val = insert("ASN", ID_TOK);
   }
   else if ((strcmp(s, "GLN") == 0) || (strcmp(s, "Q") == 0)) {
      type = RTYPE_NODE;
      val = lookup("GLN"); if(val == 0) val = insert("GLN", ID_TOK);
   }
   else if ((strcmp(s, "TRP") == 0) || (strcmp(s, "W") == 0)) {
      type = RTYPE_NODE;
      val = lookup("TRP"); if(val == 0) val = insert("TRP", ID_TOK);
   }
   else if (strcmp(s, "ACE") == 0) {
      type = RTYPE_NODE;
      val = lookup("ACE"); if(val == 0) val = insert("ACE", ID_TOK);
   }
   else if (strcmp(s, "ASX") == 0) {
      type = RTYPE_NODE;
      val = lookup("ASX"); if(val == 0) val = insert("ASX", ID_TOK);
   }
   else if (strcmp(s, "GLX") == 0) {
      type = RTYPE_NODE;
      val = lookup("GLX"); if(val == 0) val = insert("GLX", ID_TOK);
   }
   else if (strcmp(s, "MSE") == 0) {
      type = RTYPE_NODE;
      val = lookup("MSE"); if(val == 0) val = insert("MSE", ID_TOK);
   }
   else if (strcmp(s, "PCA") == 0) {
      type = RTYPE_NODE;
      val = lookup("PCA"); if(val == 0) val = insert("PCA", ID_TOK);
   }
   else if (strcmp(s, "NH2") == 0) {
      type = RTYPE_NODE;
      val = lookup("NH2"); if(val == 0) val = insert("NH2", ID_TOK);
   }
   else if (strcmp(s, "NME") == 0) {
      type = RTYPE_NODE;
      val = lookup("NME"); if(val == 0) val = insert("NME", ID_TOK);
   }
   else if (strcmp(s, "FOR") == 0) {
      type = RTYPE_NODE;
      val = lookup("FOR"); if(val == 0) val = insert("FOR", ID_TOK);
   }
   else if ((strncmp(s, "RES", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      type = RTYPE_NODE;
      for(tmpstr = s+3; *tmpstr; tmpstr++) { /* substitute blank for _ */
	 if (*tmpstr == '_') {*tmpstr = ' ';}
      }
      val = lookup(s+3); if(val == 0) val = insert(s+3, ID_TOK);
   }
   else if ((strncmp(s, "OLT", 3) == 0) && isdigit(s[3])) {
      type = OCC_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "OGT", 3) == 0) && isdigit(s[3])) {
      type = OCC_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BLT", 3) == 0) && isdigit(s[3])) {
      type = B_LT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "BGT", 3) == 0) && isdigit(s[3])) {
      type = B_GT_NODE; val = parseInteger(s,3,10);
   }
   else if ((strncmp(s, "INS", 3) == 0) && (isalnum(s[3])||(s[3]=='_'))) {
      if (s[3] == '_') {s[3] = ' ';}
      type = INS_NODE; val = (unsigned char)s[3];
   }
   else {
        char msg[200];
	sprintf(msg,"syntax: unknown identifier: %s", s);
	errmsg(msg);
	ParseError = TRUE;
        type = FALSE_NODE;
        val = 0;
   }

   lhs = makeTerminal(type, val);
   matchTok(ID_TOK);
   return lhs;
}